

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
* generate_list<trng::lcg64_shift>(lcg64_shift *r1,lcg64_shift *r2,long N,long skip1,long skip2)

{
  long in_RCX;
  tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_RDI;
  long in_R8;
  long in_R9;
  long j_1;
  long j;
  long i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff48;
  lcg64_shift *in_stack_ffffffffffffff50;
  undefined8 local_98;
  undefined8 local_90;
  size_type in_stack_ffffffffffffff78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  undefined8 local_78;
  
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x287cce);
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x287cd8);
  if (0 < in_RCX) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  for (local_78 = 0; local_78 < in_RCX; local_78 = local_78 + 1) {
    in_stack_ffffffffffffff50 =
         (lcg64_shift *)trng::lcg64_shift::operator()(in_stack_ffffffffffffff50);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff50,
               (value_type_conflict1 *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff48 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         trng::lcg64_shift::operator()(in_stack_ffffffffffffff50);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff50,
               (value_type_conflict1 *)in_stack_ffffffffffffff48);
    for (local_90 = 0; local_90 < in_R8; local_90 = local_90 + 1) {
      trng::lcg64_shift::operator()(in_stack_ffffffffffffff50);
    }
    for (local_98 = 0; local_98 < in_R9; local_98 = local_98 + 1) {
      trng::lcg64_shift::operator()(in_stack_ffffffffffffff50);
    }
  }
  std::
  tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::
  tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&,_true>
            ((tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x287e47);
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI);
  return in_RDI;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}